

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

void duckdb::MedianAbsoluteDeviationOperation<float>::
     Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  ValidityMask *fmask_p;
  bool bVar1;
  CursorType *dmask_p;
  float *pfVar2;
  unsigned_long *v_t;
  WindowQuantileState<float> *this;
  CursorType *data_00;
  WindowQuantileState<float> *frames_00;
  const_reference pvVar3;
  unsigned_long *index;
  idx_t in_RCX;
  SubFrames *in_RDX;
  CursorType *in_RSI;
  WindowQuantileState<float> *in_RDI;
  Vector *in_R8;
  QuantileValue *in_R9;
  float fVar4;
  long in_stack_00000008;
  MadIndirect mad_indirect;
  MAD mad;
  ID indirect;
  Interpolator<false> interp;
  SubFrames *prevs;
  unsigned_long *index2;
  float med;
  WindowQuantileState<float> *window_state;
  value_type *quantile;
  QuantileBindData *bind_data;
  ValidityMask *rmask;
  idx_t n;
  QuantileIncluded<float> included;
  float *rdata;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<float,_duckdb::QuantileStandardType> *gstate;
  QuantileState<float,_duckdb::QuantileStandardType> *state;
  size_type in_stack_fffffffffffffee8;
  vector<duckdb::FrameBounds,_true> *pvVar5;
  QuantileState<float,_duckdb::QuantileStandardType> *in_stack_fffffffffffffef0;
  WindowPartitionInput *in_stack_fffffffffffffef8;
  WindowQuantileState<float> *in_stack_ffffffffffffff00;
  MadAccessor<float,_float,_float> in_stack_ffffffffffffff08;
  QuantileIndirect<float> in_stack_ffffffffffffff10;
  QuantileIncluded<float> in_stack_ffffffffffffff18;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffff30;
  SubFrames *in_stack_ffffffffffffff38;
  QuantileIncluded<float> *in_stack_ffffffffffffff40;
  SubFrames *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  WindowQuantileState<float> *pWVar6;
  Vector *in_stack_ffffffffffffff88;
  Interpolator<false> *in_stack_ffffffffffffff98;
  SubFrames *frames_01;
  
  frames_01 = in_RDX;
  dmask_p = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                      ((QuantileState<float,_duckdb::QuantileStandardType> *)
                       in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fmask_p = (ValidityMask *)(in_RSI->scan).current_row_index;
  pfVar2 = FlatVector::GetData<float>((Vector *)0x1db72cd);
  QuantileIncluded<float>::QuantileIncluded
            ((QuantileIncluded<float> *)&stack0xffffffffffffff98,fmask_p,dmask_p);
  v_t = (unsigned_long *)
        QuantileOperation::FrameSize<float>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (v_t == (unsigned_long *)0x0) {
    FlatVector::Validity((Vector *)0x1db7327);
    TemplatedValidityMask<unsigned_long>::Set
              ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff00,
               (idx_t)in_stack_fffffffffffffef8,SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_fffffffffffffef0);
    this = (WindowQuantileState<float> *)
           FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_fffffffffffffef0);
    data_00 = (CursorType *)
              vector<duckdb::QuantileValue,_true>::operator[]
                        ((vector<duckdb::QuantileValue,_true> *)in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8);
    frames_00 = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                          (in_stack_fffffffffffffef0);
    if ((in_RDX == (SubFrames *)0x0) ||
       (bVar1 = QuantileState<float,_duckdb::QuantileStandardType>::HasTree
                          (in_stack_fffffffffffffef0), !bVar1)) {
      WindowQuantileState<float>::UpdateSkip
                (this,data_00,(SubFrames *)frames_00,
                 (IncludedType *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      WindowQuantileState<float>::WindowScalar<float,false>
                (in_RDI,in_RSI,frames_01,in_RCX,in_R8,in_R9);
    }
    else {
      QuantileState<float,_duckdb::QuantileStandardType>::GetWindowState
                ((QuantileState<float,_duckdb::QuantileStandardType> *)0x1db73c5);
      WindowQuantileState<float>::WindowScalar<float,false>
                (in_RDI,in_RSI,frames_01,in_RCX,in_R8,in_R9);
    }
    pWVar6 = frames_00;
    pvVar3 = vector<duckdb::FrameBounds,_true>::back(in_stack_ffffffffffffff30);
    pvVar5 = (vector<duckdb::FrameBounds,_true> *)pvVar3->end;
    vector<duckdb::FrameBounds,_true>::front((vector<duckdb::FrameBounds,_true> *)0x1db7492);
    WindowQuantileState<float>::SetCount
              (in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    index = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1db74b4);
    ReuseIndexes(index,&pWVar6->prevs,in_stack_ffffffffffffff50);
    ::std::partition<unsigned_long*,duckdb::QuantileIncluded<float>>
              ((unsigned_long *)in_stack_ffffffffffffff10.data,
               (unsigned_long *)in_stack_ffffffffffffff08.median,in_stack_ffffffffffffff18);
    Interpolator<false>::Interpolator
              ((Interpolator<false> *)in_stack_ffffffffffffff00,
               (QuantileValue *)in_stack_fffffffffffffef8,(idx_t)frames_00,
               SUB81((ulong)pvVar5 >> 0x38,0));
    QuantileIndirect<float>::QuantileIndirect
              ((QuantileIndirect<float> *)&stack0xffffffffffffff10,dmask_p);
    MadAccessor<float,_float,_float>::MadAccessor
              ((MadAccessor<float,_float,_float> *)&stack0xffffffffffffff08,
               (float *)&stack0xffffffffffffff6c);
    QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>::
    QuantileComposed((QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
                      *)&stack0xfffffffffffffef8,
                     (MadAccessor<float,_float,_float> *)&stack0xffffffffffffff08,
                     (QuantileIndirect<float> *)&stack0xffffffffffffff10);
    fVar4 = Interpolator<false>::
            Operation<unsigned_long,float,duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>
                      (in_stack_ffffffffffffff98,v_t,in_stack_ffffffffffffff88,
                       (QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
                        *)this);
    pfVar2[in_stack_00000008] = fVar4;
    vector<duckdb::FrameBounds,_true>::operator=
              ((vector<duckdb::FrameBounds,_true> *)frames_00,pvVar5);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		if (!n) {
			auto &rmask = FlatVector::Validity(result);
			rmask.Set(ridx, false);
			return;
		}

		//	Compute the median
		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &quantile = bind_data.quantiles[0];
		auto &window_state = state.GetOrCreateWindowState();
		MEDIAN_TYPE med;
		if (gstate && gstate->HasTree()) {
			med = gstate->GetWindowState().template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		} else {
			window_state.UpdateSkip(data, frames, included);
			med = window_state.template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		}

		//  Lazily initialise frame state
		window_state.SetCount(frames.back().end - frames.front().start);
		auto index2 = window_state.m.data();
		D_ASSERT(index2);

		// The replacement trick does not work on the second index because if
		// the median has changed, the previous order is not correct.
		// It is probably close, however, and so reuse is helpful.
		auto &prevs = window_state.prevs;
		ReuseIndexes(index2, frames, prevs);
		std::partition(index2, index2 + window_state.count, included);

		Interpolator<false> interp(quantile, n, false);

		// Compute mad from the second index
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);

		using MAD = MadAccessor<INPUT_TYPE, RESULT_TYPE, MEDIAN_TYPE>;
		MAD mad(med);

		using MadIndirect = QuantileComposed<MAD, ID>;
		MadIndirect mad_indirect(mad, indirect);
		rdata[ridx] = interp.template Operation<idx_t, RESULT_TYPE, MadIndirect>(index2, result, mad_indirect);

		//	Prev is used by both skip lists and increments
		prevs = frames;
	}